

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

void __thiscall bitfoot::Bitfoot::AddEpCaps<true>(Bitfoot *this)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  int from;
  
  if ((long)this->ep != 0x40) {
    uVar3 = this->pc[3] & *(ulong *)(_PAWN_ATK + (long)this->ep * 8);
    while (uVar3 != 0) {
      lVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar3 = uVar3 - 1 & uVar3;
      from = (int)lVar1;
      bVar2 = Pinned<true>(this,from,this->ep);
      if (!bVar2) {
        bVar2 = EpPinned<true>(this,from,this->ep);
        if (!bVar2) {
          AddMove<true,(bitfoot::MoveType)5>(this,3,from,this->ep,100,2,0);
        }
      }
    }
    return;
  }
  __assert_fail("ep != NoSquare",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                ,0xb36,"void bitfoot::Bitfoot::AddEpCaps() [color = true]");
}

Assistant:

inline void AddEpCaps() {
    assert(ep != NoSquare);
    int from;
    uint64_t pawns = (_PAWN_ATK[!color][ep] & pc[color|Pawn]);
    while (pawns) {
      PopLowSquare(pawns, from);
      if (!Pinned<color>(from, ep) && !EpPinned<color>(from, ep)) {
        AddMove<color, EnPassant>((color|Pawn), from, ep,
                                  PawnValue, ((!color)|Pawn), 0);
      }
    }
  }